

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               ImGuiSliderFlags flags)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float local_7c;
  float local_68;
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar2 = GImGui;
  auVar17._4_60_ = in_register_00001204;
  auVar17._0_4_ = v_speed;
  auVar17 = ZEXT1664(auVar17._0_16_);
  uVar4 = data_type & 0xfffffffe;
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    auVar17 = ZEXT464((uint)((float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio));
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  IVar5 = GImGui->ActiveIdSource;
  auVar16 = auVar17._0_16_;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) ||
       (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar3)) {
      IVar5 = pIVar2->ActiveIdSource;
      auVar17 = ZEXT1664(auVar16);
      goto LAB_0017da6c;
    }
    fVar15 = (pIVar2->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar15 = fVar15 * 0.01;
    }
    fVar11 = auVar17._0_4_;
    if ((pIVar2->IO).KeyShift != false) {
      fVar15 = fVar15 * 10.0;
    }
  }
  else {
LAB_0017da6c:
    fVar11 = auVar17._0_4_;
    fVar15 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      uVar6 = 0;
      if (uVar4 == 8) {
        uVar6 = ImParseFormatPrecision(format,3);
      }
      auVar13._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar13._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar13._0_16_);
      fVar15 = *(float *)((long)&local_38 + (ulong)uVar10 * 4);
      if ((int)uVar6 < 0) {
        auVar12 = SUB6416(ZEXT464(0x800000),0);
      }
      else if (uVar6 < 10) {
        auVar12 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar6 * 4));
      }
      else {
        auVar14._0_4_ = powf(10.0,(float)(int)-uVar6);
        auVar14._4_60_ = extraout_var;
        auVar12 = auVar14._0_16_;
      }
      auVar1 = vcmpss_avx(auVar12,auVar16,2);
      auVar16 = vblendvps_avx(auVar12,auVar16,auVar1);
      fVar11 = auVar16._0_4_;
    }
  }
  bVar9 = uVar4 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar15 = fVar15 * fVar11;
  if ((flags & 0x100000U) != 0) {
    fVar15 = -fVar15;
  }
  if ((bVar9 != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar15 = fVar15 / (float)(v_max - v_min);
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar15)) goto LAB_0017dbbb;
    bVar3 = fVar15 < 0.0 && *v <= v_min;
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      pIVar2->DragCurrentAccum = fVar15 + pIVar2->DragCurrentAccum;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    iVar8 = *v;
    if (bVar9 == 0) {
      iVar8 = iVar8 + (int)pIVar2->DragCurrentAccum;
      local_68 = 0.0;
      local_7c = 0.0;
    }
    else {
      iVar7 = ImParseFormatPrecision(format,3);
      local_7c = powf(0.1,(float)iVar7);
      local_68 = ScaleRatioFromValueT<int,int,float>(data_type,iVar8,v_min,v_max,true,local_7c,0.0);
      iVar8 = ScaleValueFromRatioT<int,int,float>
                        (data_type,local_68 + pIVar2->DragCurrentAccum,v_min,v_max,true,local_7c,0.0
                        );
    }
    if ((flags & 0x40U) == 0) {
      iVar8 = RoundScalarWithFormatT<int,int>(format,data_type,iVar8);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar9 == 0) {
      iVar7 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(iVar8 - iVar7);
    }
    else {
      fVar11 = ScaleRatioFromValueT<int,int,float>(data_type,iVar8,v_min,v_max,true,local_7c,0.0);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar11 - local_68);
      iVar7 = *v;
    }
    if ((v_min < v_max) && (iVar7 != iVar8)) {
      if ((iVar8 < v_min) || (((uVar4 != 8 && (iVar7 < iVar8)) && (fVar15 < 0.0)))) {
        iVar8 = v_min;
      }
      if ((v_max < iVar8) || (((uVar4 != 8 && (iVar8 < iVar7)) && (0.0 < fVar15)))) {
        iVar8 = v_max;
      }
    }
    if (iVar7 == iVar8) {
      return false;
    }
    *v = iVar8;
    return true;
  }
LAB_0017dbbb:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}